

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O0

uint projective_eq(MontyContext *mc,mp_int *An,mp_int *Ad,mp_int *Bn,mp_int *Bd)

{
  uint uVar1;
  mp_int *a;
  mp_int *b;
  uint toret;
  mp_int *BnAd;
  mp_int *AnBd;
  mp_int *Bd_local;
  mp_int *Bn_local;
  mp_int *Ad_local;
  mp_int *An_local;
  MontyContext *mc_local;
  
  a = monty_mul(mc,An,Bd);
  b = monty_mul(mc,Bn,Ad);
  uVar1 = mp_cmp_eq(a,b);
  mp_free(a);
  mp_free(b);
  return uVar1;
}

Assistant:

static inline unsigned projective_eq(
    MontyContext *mc, mp_int *An, mp_int *Ad,
    mp_int *Bn, mp_int *Bd)
{
    mp_int *AnBd = monty_mul(mc, An, Bd);
    mp_int *BnAd = monty_mul(mc, Bn, Ad);
    unsigned toret = mp_cmp_eq(AnBd, BnAd);
    mp_free(AnBd);
    mp_free(BnAd);
    return toret;
}